

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_main.cpp
# Opt level: O2

void D_Display(void)

{
  FFont *font;
  DFrameBuffer *pDVar1;
  byte bVar2;
  char hw2d;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  FTextureID FVar7;
  uint uVar8;
  AActor *pAVar9;
  FTexture *pFVar10;
  char *tail;
  EHudState state;
  float blend [4];
  cycle_t cycles;
  DAngle local_38;
  
  if (nodrawers) {
    return;
  }
  if (screen == (DFrameBuffer *)0x0) {
    return;
  }
  cycles.Sec = 0.0;
  cycle_t::Clock(&cycles);
  pAVar9 = GC::ReadBarrier<AActor>((AActor **)(&DAT_009ba598 + (long)consoleplayer * 0x54));
  if (pAVar9 == (AActor *)0x0) {
    (&DAT_009ba598)[(long)consoleplayer * 0x54] = (&players)[(long)consoleplayer * 0x54];
  }
  if (viewactive == true) {
    pAVar9 = GC::ReadBarrier<AActor>((AActor **)(&DAT_009ba598 + (long)consoleplayer * 0x54));
    local_38.Degrees = 90.0;
    if (pAVar9 != (AActor *)0x0) {
      pAVar9 = GC::ReadBarrier<AActor>((AActor **)(&DAT_009ba598 + (long)consoleplayer * 0x54));
      local_38.Degrees = 90.0;
      if (pAVar9->player != (player_t *)0x0) {
        pAVar9 = GC::ReadBarrier<AActor>((AActor **)(&DAT_009ba598 + (long)consoleplayer * 0x54));
        local_38.Degrees = (double)pAVar9->player->FOV;
      }
    }
    R_SetFOV(&local_38);
  }
  if ((setmodeneeded == true) &&
     (iVar3 = (*Video->_vptr_IVideo[7])
                        (Video,(ulong)(uint)NewWidth,(ulong)(uint)NewHeight,(ulong)(uint)NewBits),
     (char)iVar3 != '\0')) {
    setsizeneeded = true;
    if (StatusBar != (DBaseStatusBar *)0x0) {
      (*(StatusBar->super_DObject)._vptr_DObject[0xe])();
    }
    C_NewModeAdjust();
    ST_LoadCrosshair(true);
    AM_NewResolution();
    if (vid_cursor.super_FBaseCVar.m_Callback != (_func_void_FBaseCVar_ptr *)0x0) {
      (*vid_cursor.super_FBaseCVar.m_Callback)(&vid_cursor.super_FBaseCVar);
    }
  }
  RenderTarget = (DCanvas *)screen;
  if ((setsizeneeded == true) && (StatusBar != (DBaseStatusBar *)0x0)) {
    R_ExecuteSetViewSize();
  }
  setmodeneeded = false;
  iVar3 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[8])(screen,0);
  if ((char)iVar3 != '\0') {
    ST_SetNeedRefresh();
    V_SetBorderNeedRefresh();
  }
  if (NoWipe == 0) {
    bVar2 = 1;
    if (((gamestate != wipegamestate) && (gamestate != GS_FULLCONSOLE)) &&
       (gamestate != GS_TITLELEVEL)) {
      V_SetBorderNeedRefresh();
      uVar4 = wipetype.Value;
      if ((uint)(wipegamestate + GS_FULLCONSOLE) < 3) {
        uVar4 = wipegamestate + GS_HIDECONSOLE;
      }
      iVar3 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x2a])
                        (screen,(ulong)uVar4);
      wipegamestate = gamestate;
      bVar2 = (byte)iVar3 ^ 1;
    }
  }
  else {
    V_SetBorderNeedRefresh();
    NoWipe = NoWipe + -1;
    wipegamestate = gamestate;
    bVar2 = 1;
  }
  uVar4 = I_FPSTime();
  FTextureManager::UpdateAnimations(&TexMan,uVar4);
  R_UpdateSky(uVar4);
  hw2d = false;
  switch(gamestate) {
  case GS_LEVEL:
  case GS_TITLELEVEL:
    if (gametic == 0) {
      hw2d = false;
      goto switchD_00437a19_caseD_5;
    }
    if (StatusBar != (DBaseStatusBar *)0x0) {
      blend[0] = 0.0;
      blend[1] = 0.0;
      blend[2] = 0.0;
      blend[3] = 0.0;
      (*(StatusBar->super_DObject)._vptr_DObject[0xc])();
    }
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x24])();
    (*Renderer->_vptr_FRenderer[4])(Renderer,&players + (long)consoleplayer * 0x54);
    iVar3 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x25])();
    hw2d = (char)iVar3;
    if (hw2d != '\0') {
      ST_SetNeedRefresh();
      V_SetBorderNeedRefresh();
    }
    (*Renderer->_vptr_FRenderer[7])();
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x26])();
    iVar3 = ST_Y;
    if (automapactive == true) {
      if ((hud_althud.Value == true) &&
         (viewheight == (screen->super_DSimpleCanvas).super_DCanvas.Height)) {
        ST_Y = viewheight;
      }
      AM_Drawer();
    }
    ST_Y = iVar3;
    if (((automapactive & 1U) == 0) || (viewactive == true)) {
      V_RefreshViewBorder();
    }
    iVar3 = (screen->super_DSimpleCanvas).super_DCanvas.Height;
    if (((hud_althud.Value == true) && (viewheight == iVar3)) && (10 < screenblocks.Value)) {
      state = HUD_AltHud;
      DBaseStatusBar::DrawBottomStuff(StatusBar,HUD_AltHud);
      if ((DrawFSHUD != false) || (automapactive == true)) {
        DrawHUD();
      }
    }
    else {
      if (((viewheight == iVar3) && (viewactive == true)) && (10 < screenblocks.Value)) {
        state = HUD_None - DrawFSHUD;
      }
      else {
        state = HUD_StatusBar;
      }
      DBaseStatusBar::DrawBottomStuff(StatusBar,state);
    }
    (*(StatusBar->super_DObject)._vptr_DObject[8])(StatusBar,(ulong)state);
    DBaseStatusBar::DrawTopStuff(StatusBar,state);
    break;
  case GS_INTERMISSION:
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x24])(screen,0,0,0,0)
    ;
    iVar3 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x25])
                      (screen,0);
    hw2d = (char)iVar3;
    WI_Drawer();
    break;
  case GS_FINALE:
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x24])(screen,0,0,0,0)
    ;
    iVar3 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x25])
                      (screen,0);
    hw2d = (char)iVar3;
    F_Drawer();
    break;
  case GS_DEMOSCREEN:
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x24])(screen,0,0,0,0)
    ;
    iVar3 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x25])
                      (screen,0);
    hw2d = (char)iVar3;
    D_PageDrawer();
    break;
  case GS_FULLCONSOLE:
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x24])(screen,0,0,0,0)
    ;
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x25])(screen,0);
    C_DrawConsole(false);
    M_Drawer();
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x19])();
    return;
  default:
    goto switchD_00437a19_caseD_5;
  }
  CT_Drawer();
switchD_00437a19_caseD_5:
  if (((paused != 0) || (pauseext == true)) && (menuactive == MENU_Off)) {
    FString::FString((FString *)blend,"By ");
    pFVar10 = FTextureManager::operator()(&TexMan,gameinfo.PauseSign.Chars);
    iVar3 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
    iVar5 = FTexture::GetScaledWidth(pFVar10);
    iVar5 = iVar5 * CleanXfac;
    iVar6 = FTexture::GetScaledLeftOffset(pFVar10);
    DCanvas::DrawTexture
              ((DCanvas *)screen,pFVar10,(double)(iVar6 * CleanXfac + (iVar3 - iVar5) / 2),4.0,
               0x40001393,1,0);
    if (((long)paused != 0) && (multiplayer == true)) {
      tail = userinfo_t::GetName((userinfo_t *)((long)&(&pr_dmspawn)[(long)paused * 6].sfmt + 0x30))
      ;
      FString::operator+=((FString *)blend,tail);
      pDVar1 = screen;
      font = SmallFont;
      iVar3 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
      iVar5 = FFont::StringWidth(SmallFont,(BYTE *)blend._0_8_);
      iVar5 = iVar5 * CleanXfac;
      iVar6 = FTexture::GetScaledHeight(pFVar10);
      DCanvas::DrawText((DCanvas *)pDVar1,font,6,(iVar3 - iVar5) / 2,iVar6 * CleanYfac + 4,
                        (char *)blend._0_8_,0x40001393,1,0);
    }
    FString::~FString((FString *)blend);
  }
  if (D_DrawIcon != (char *)0x0) {
    FVar7 = FTextureManager::CheckForTexture(&TexMan,D_DrawIcon,8,1);
    pDVar1 = screen;
    D_DrawIcon = (char *)0x0;
    if (0 < FVar7.texnum) {
      if ((uint)FVar7.texnum < TexMan.Textures.Count) {
        pFVar10 = TexMan.Textures.Array[(uint)FVar7.texnum].Texture;
      }
      else {
        pFVar10 = (FTexture *)0x0;
      }
      iVar3 = FTexture::GetScaledWidth(pFVar10);
      iVar5 = FTexture::GetScaledHeight(pFVar10);
      DCanvas::DrawTexture
                ((DCanvas *)pDVar1,pFVar10,(double)(iVar3 / -2 + 0xa0),(double)(iVar5 / -2 + 100),
                 0x40001391,1,0);
    }
    NoWipe = 10;
  }
  if (((long)texture_browse_index.Value != -1) &&
     (texture_browse_index.Value < (int)TexMan.Textures.Count)) {
    if ((uint)texture_browse_index.Value < TexMan.Textures.Count) {
      pFVar10 = TexMan.Textures.Array[texture_browse_index.Value].Texture;
    }
    else {
      pFVar10 = (FTexture *)0x0;
    }
    DCanvas::DrawTexture((DCanvas *)screen,pFVar10,0.0,0.0,0x40001391,1,0x4000139b,0,0x4000139c,0,0)
    ;
    DCanvas::DrawText((DCanvas *)screen,ConFont,9,0,
                      (screen->super_DSimpleCanvas).super_DCanvas.Height - ConFont->FontHeight,
                      (pFVar10->Name).Chars,0);
  }
  if (snd_drawoutput.Value != 0) {
    (*GSnd->_vptr_SoundRenderer[0x20])();
  }
  if ((bVar2 | NoWipe < 0) == 1) {
    NetUpdate();
    C_DrawConsole((bool)hw2d);
    M_Drawer();
    FStat::PrintStat();
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x19])();
  }
  else {
    (*GSnd->_vptr_SoundRenderer[0x16])(GSnd,1,1);
    (*I_FreezeTime)(true);
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x2b])();
    uVar4 = I_MSTime();
    NetUpdate();
    do {
      do {
        I_WaitVBL(cl_wipe_delay.Value);
        uVar8 = I_MSTime();
      } while ((uVar8 - uVar4) * 0x28 < 1000);
      iVar3 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x2c])
                        (screen,1);
      C_DrawConsole((bool)hw2d);
      M_Drawer();
      (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x19])();
      NetUpdate();
      uVar4 = uVar8;
    } while ((char)iVar3 == '\0');
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x2d])();
    (*I_FreezeTime)(false);
    (*GSnd->_vptr_SoundRenderer[0x16])(GSnd,0,1);
  }
  cycle_t::Unclock(&cycles);
  FrameCycles.Sec = cycles.Sec;
  return;
}

Assistant:

void D_Display ()
{
	bool wipe;
	bool hw2d;

	if (nodrawers || screen == NULL)
		return; 				// for comparative timing / profiling
	
	cycle_t cycles;
	
	cycles.Reset();
	cycles.Clock();

	if (players[consoleplayer].camera == NULL)
	{
		players[consoleplayer].camera = players[consoleplayer].mo;
	}

	if (viewactive)
	{
		R_SetFOV (players[consoleplayer].camera && players[consoleplayer].camera->player ?
			players[consoleplayer].camera->player->FOV : 90.f);
	}

	// [RH] change the screen mode if needed
	if (setmodeneeded)
	{
		// Change screen mode.
		if (Video->SetResolution (NewWidth, NewHeight, NewBits))
		{
			// Recalculate various view parameters.
			setsizeneeded = true;
			// Let the status bar know the screen size changed
			if (StatusBar != NULL)
			{
				StatusBar->ScreenSizeChanged ();
			}
			// Refresh the console.
			C_NewModeAdjust ();
			// Reload crosshair if transitioned to a different size
			ST_LoadCrosshair (true);
			AM_NewResolution ();
			// Reset the mouse cursor in case the bit depth changed
			vid_cursor.Callback();
		}
	}

	RenderTarget = screen;

	// change the view size if needed
	if (setsizeneeded && StatusBar != NULL)
	{
		R_ExecuteSetViewSize ();
	}
	setmodeneeded = false;

	if (screen->Lock (false))
	{
		ST_SetNeedRefresh();
		V_SetBorderNeedRefresh();
	}

	// [RH] Allow temporarily disabling wipes
	if (NoWipe)
	{
		V_SetBorderNeedRefresh();
		NoWipe--;
		wipe = false;
		wipegamestate = gamestate;
	}
	else if (gamestate != wipegamestate && gamestate != GS_FULLCONSOLE && gamestate != GS_TITLELEVEL)
	{ // save the current screen if about to wipe
		V_SetBorderNeedRefresh();
		switch (wipegamestate)
		{
		default:
			wipe = screen->WipeStartScreen (wipetype);
			break;

		case GS_FORCEWIPEFADE:
			wipe = screen->WipeStartScreen (wipe_Fade);
			break;

		case GS_FORCEWIPEBURN:
			wipe = screen->WipeStartScreen (wipe_Burn);
			break;

		case GS_FORCEWIPEMELT:
			wipe = screen->WipeStartScreen (wipe_Melt);
			break;
		}
		wipegamestate = gamestate;
	}
	else
	{
		wipe = false;
	}

	hw2d = false;


	{
		unsigned int nowtime = I_FPSTime();
		TexMan.UpdateAnimations(nowtime);
		R_UpdateSky(nowtime);
		switch (gamestate)
		{
		case GS_FULLCONSOLE:
			screen->SetBlendingRect(0,0,0,0);
			hw2d = screen->Begin2D(false);
			C_DrawConsole (false);
			M_Drawer ();
			screen->Update ();
			return;

		case GS_LEVEL:
		case GS_TITLELEVEL:
			if (!gametic)
				break;

			if (StatusBar != NULL)
			{
				float blend[4] = { 0, 0, 0, 0 };
				StatusBar->BlendView (blend);
			}
			screen->SetBlendingRect(viewwindowx, viewwindowy,
				viewwindowx + viewwidth, viewwindowy + viewheight);

			Renderer->RenderView(&players[consoleplayer]);

			if ((hw2d = screen->Begin2D(viewactive)))
			{
				// Redraw everything every frame when using 2D accel
				ST_SetNeedRefresh();
				V_SetBorderNeedRefresh();
			}
			Renderer->DrawRemainingPlayerSprites();
			screen->DrawBlendingRect();
			if (automapactive)
			{
				int saved_ST_Y = ST_Y;
				if (hud_althud && viewheight == SCREENHEIGHT)
				{
					ST_Y = viewheight;
				}
				AM_Drawer ();
				ST_Y = saved_ST_Y;
			}
			if (!automapactive || viewactive)
			{
				V_RefreshViewBorder ();
			}

			if (hud_althud && viewheight == SCREENHEIGHT && screenblocks > 10)
			{
				StatusBar->DrawBottomStuff (HUD_AltHud);
				if (DrawFSHUD || automapactive) DrawHUD();
				StatusBar->Draw (HUD_AltHud);
				StatusBar->DrawTopStuff (HUD_AltHud);
			}
			else 
			if (viewheight == SCREENHEIGHT && viewactive && screenblocks > 10)
			{
				EHudState state = DrawFSHUD ? HUD_Fullscreen : HUD_None;
				StatusBar->DrawBottomStuff (state);
				StatusBar->Draw (state);
				StatusBar->DrawTopStuff (state);
			}
			else
			{
				StatusBar->DrawBottomStuff (HUD_StatusBar);
				StatusBar->Draw (HUD_StatusBar);
				StatusBar->DrawTopStuff (HUD_StatusBar);
			}
			CT_Drawer ();
			break;

		case GS_INTERMISSION:
			screen->SetBlendingRect(0,0,0,0);
			hw2d = screen->Begin2D(false);
			WI_Drawer ();
			CT_Drawer ();
			break;

		case GS_FINALE:
			screen->SetBlendingRect(0,0,0,0);
			hw2d = screen->Begin2D(false);
			F_Drawer ();
			CT_Drawer ();
			break;

		case GS_DEMOSCREEN:
			screen->SetBlendingRect(0,0,0,0);
			hw2d = screen->Begin2D(false);
			D_PageDrawer ();
			CT_Drawer ();
			break;

		default:
			break;
		}
	}
	// draw pause pic
	if ((paused || pauseext) && menuactive == MENU_Off)
	{
		FTexture *tex;
		int x;
		FString pstring = "By ";

		tex = TexMan(gameinfo.PauseSign);
		x = (SCREENWIDTH - tex->GetScaledWidth() * CleanXfac)/2 +
			tex->GetScaledLeftOffset() * CleanXfac;
		screen->DrawTexture (tex, x, 4, DTA_CleanNoMove, true, TAG_DONE);
		if (paused && multiplayer)
		{
			pstring += players[paused - 1].userinfo.GetName();
			screen->DrawText(SmallFont, CR_RED,
				(screen->GetWidth() - SmallFont->StringWidth(pstring)*CleanXfac) / 2,
				(tex->GetScaledHeight() * CleanYfac) + 4, pstring, DTA_CleanNoMove, true, TAG_DONE);
		}
	}

	// [RH] Draw icon, if any
	if (D_DrawIcon)
	{
		FTextureID picnum = TexMan.CheckForTexture (D_DrawIcon, FTexture::TEX_MiscPatch);

		D_DrawIcon = NULL;
		if (picnum.isValid())
		{
			FTexture *tex = TexMan[picnum];
			screen->DrawTexture (tex, 160 - tex->GetScaledWidth()/2, 100 - tex->GetScaledHeight()/2,
				DTA_320x200, true, TAG_DONE);
		}
		NoWipe = 10;
	}

	if (-1 != texture_browse_index && texture_browse_index < TexMan.NumTextures())
	{
		FTexture* const texture = TexMan.ByIndex(texture_browse_index);

		screen->DrawTexture(texture, 0, 0, 
			DTA_320x200, true, DTA_TopOffset, 0, DTA_LeftOffset, 0, TAG_DONE);
		screen->DrawText(ConFont, CR_WHITE, 0, SCREENHEIGHT - ConFont->GetHeight(), texture->Name, TAG_DONE);
	}

	if (snd_drawoutput)
	{
		GSnd->DrawWaveDebug(snd_drawoutput);
	}

	if (!wipe || NoWipe < 0)
	{
		NetUpdate ();			// send out any new accumulation
		// normal update
		C_DrawConsole (hw2d);	// draw console
		M_Drawer ();			// menu is drawn even on top of everything
		FStat::PrintStat ();
		screen->Update ();		// page flip or blit buffer
	}
	else
	{
		// wipe update
		unsigned int wipestart, nowtime, diff;
		bool done;

		GSnd->SetSfxPaused(true, 1);
		I_FreezeTime(true);
		screen->WipeEndScreen ();

		wipestart = I_MSTime();
		NetUpdate();		// send out any new accumulation

		do
		{
			do
			{
				I_WaitVBL( cl_wipe_delay );
				nowtime = I_MSTime();
				diff = (nowtime - wipestart) * 40 / 1000;	// Using 35 here feels too slow.
			} while (diff < 1);
			wipestart = nowtime;
			done = screen->WipeDo (1);
			C_DrawConsole (hw2d);	// console and
			M_Drawer ();			// menu are drawn even on top of wipes
			screen->Update ();		// page flip or blit buffer
			NetUpdate ();			// [RH] not sure this is needed anymore
		} while (!done);
		screen->WipeCleanup();
		I_FreezeTime(false);
		GSnd->SetSfxPaused(false, 1);
	}

	cycles.Unclock();
	FrameCycles = cycles;
}